

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall cmFindLibraryHelper::cmFindLibraryHelper(cmFindLibraryHelper *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *pcVar3;
  char *pcVar4;
  char *pcVar5;
  cmState *this_00;
  allocator local_61 [9];
  string local_58;
  string *local_38;
  
  this->Makefile = mf;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PrefixRegexStr)._M_dataplus._M_p = (pointer)&(this->PrefixRegexStr).field_2;
  (this->PrefixRegexStr)._M_string_length = 0;
  (this->PrefixRegexStr).field_2._M_local_buf[0] = '\0';
  (this->SuffixRegexStr)._M_dataplus._M_p = (pointer)&(this->SuffixRegexStr).field_2;
  (this->SuffixRegexStr)._M_string_length = 0;
  local_38 = &this->PrefixRegexStr;
  (this->SuffixRegexStr).field_2._M_local_buf[0] = '\0';
  (this->BestPath)._M_dataplus._M_p = (pointer)&(this->BestPath).field_2;
  (this->BestPath)._M_string_length = 0;
  (this->BestPath).field_2._M_local_buf[0] = '\0';
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TestPath)._M_dataplus._M_p = (pointer)&(this->TestPath).field_2;
  (this->TestPath)._M_string_length = 0;
  (this->TestPath).field_2._M_local_buf[0] = '\0';
  pcVar3 = cmMakefile::GetGlobalGenerator(mf);
  this->GG = pcVar3;
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_58,"CMAKE_FIND_LIBRARY_PREFIXES",local_61);
  pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_58,"CMAKE_FIND_LIBRARY_SUFFIXES",local_61);
  pcVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,pcVar4,local_61);
  cmSystemTools::ExpandListArgument(&local_58,&this->Prefixes,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,pcVar5,local_61);
  cmSystemTools::ExpandListArgument(&local_58,&this->Suffixes,true);
  std::__cxx11::string::~string((string *)&local_58);
  RegexFromList(this,local_38,&this->Prefixes);
  RegexFromList(this,&this->SuffixRegexStr,&this->Suffixes);
  this_00 = cmMakefile::GetState(this->Makefile);
  std::__cxx11::string::string((string *)&local_58,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",local_61);
  bVar2 = cmState::GetGlobalPropertyAsBool(this_00,&local_58);
  this->OpenBSD = bVar2;
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

cmFindLibraryHelper::cmFindLibraryHelper(cmMakefile* mf)
  : Makefile(mf)
{
  this->GG = this->Makefile->GetGlobalGenerator();

  // Collect the list of library name prefixes/suffixes to try.
  const char* prefixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_PREFIXES");
  const char* suffixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_SUFFIXES");
  cmSystemTools::ExpandListArgument(prefixes_list, this->Prefixes, true);
  cmSystemTools::ExpandListArgument(suffixes_list, this->Suffixes, true);
  this->RegexFromList(this->PrefixRegexStr, this->Prefixes);
  this->RegexFromList(this->SuffixRegexStr, this->Suffixes);

  // Check whether to use OpenBSD-style library version comparisons.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");
}